

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall Clara::CommandLine<Catch::ConfigData>::ArgBinder::~ArgBinder(ArgBinder *this)

{
  auto_ptr_ref<Clara::CommandLine<Catch::ConfigData>::Arg> __ref;
  undefined1 uVar1;
  undefined1 uVar2;
  element_type *peVar3;
  logic_error *this_00;
  Arg *in_RDI;
  __enable_if_t<is_constructible<value_type,_pair<int,_Arg>_>::value,_pair<iterator,_bool>_> _Var4;
  element_type *in_stack_ffffffffffffff10;
  pair<int,_Clara::CommandLine<Catch::ConfigData>::Arg> *in_stack_ffffffffffffff18;
  undefined6 in_stack_ffffffffffffff20;
  undefined1 in_stack_ffffffffffffff26;
  undefined1 in_stack_ffffffffffffff27;
  undefined7 in_stack_ffffffffffffff38;
  auto_ptr<Clara::CommandLine<Catch::ConfigData>::Arg> local_b8;
  Arg *local_b0;
  _Base_ptr local_a8;
  undefined1 in_stack_ffffffffffffff60;
  undefined7 in_stack_ffffffffffffff61;
  
  if ((in_RDI->boundField).functionObj != (IArgFunction<Catch::ConfigData> *)0x0) {
    Arg::validate((Arg *)CONCAT71(in_stack_ffffffffffffff61,in_stack_ffffffffffffff60));
    uVar1 = Arg::isFixedPositional((Arg *)&in_RDI->shortNames);
    if ((bool)uVar1) {
      std::make_pair<int&,Clara::CommandLine<Catch::ConfigData>::Arg&>
                (&in_stack_ffffffffffffff18->first,in_stack_ffffffffffffff10);
      _Var4 = std::
              map<int,Clara::CommandLine<Catch::ConfigData>::Arg,std::less<int>,std::allocator<std::pair<int_const,Clara::CommandLine<Catch::ConfigData>::Arg>>>
              ::insert<std::pair<int,Clara::CommandLine<Catch::ConfigData>::Arg>>
                        ((map<int,_Clara::CommandLine<Catch::ConfigData>::Arg,_std::less<int>,_std::allocator<std::pair<const_int,_Clara::CommandLine<Catch::ConfigData>::Arg>_>_>
                          *)CONCAT17(in_stack_ffffffffffffff27,
                                     CONCAT16(in_stack_ffffffffffffff26,in_stack_ffffffffffffff20)),
                         in_stack_ffffffffffffff18);
      local_a8 = (_Base_ptr)_Var4.first._M_node;
      std::pair<int,_Clara::CommandLine<Catch::ConfigData>::Arg>::~pair
                ((pair<int,_Clara::CommandLine<Catch::ConfigData>::Arg> *)0x191458);
      if (*(int *)&(in_RDI->boundField).functionObj[0xb]._vptr_IArgFunction <
          *(int *)&in_RDI[1].boundField.functionObj) {
        *(undefined4 *)&(in_RDI->boundField).functionObj[0xb]._vptr_IArgFunction =
             *(undefined4 *)&in_RDI[1].boundField.functionObj;
      }
    }
    else {
      uVar2 = Arg::isAnyPositional(in_stack_ffffffffffffff10);
      if ((bool)uVar2) {
        peVar3 = std::auto_ptr<Clara::CommandLine<Catch::ConfigData>::Arg>::get
                           ((auto_ptr<Clara::CommandLine<Catch::ConfigData>::Arg> *)
                            ((in_RDI->boundField).functionObj + 10));
        if (peVar3 != (element_type *)0x0) {
          this_00 = (logic_error *)__cxa_allocate_exception(0x10);
          std::logic_error::logic_error(this_00,"Only one unpositional argument can be added");
          __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
        }
        in_stack_ffffffffffffff10 = (element_type *)operator_new(0x88);
        Arg::Arg(in_RDI,(Arg *)CONCAT17(uVar1,in_stack_ffffffffffffff38));
        std::auto_ptr<Clara::CommandLine<Catch::ConfigData>::Arg>::auto_ptr
                  (&local_b8,in_stack_ffffffffffffff10);
        local_b0 = (Arg *)std::auto_ptr::operator_cast_to_auto_ptr_ref
                                    ((auto_ptr<Clara::CommandLine<Catch::ConfigData>::Arg> *)
                                     in_stack_ffffffffffffff18);
        __ref._M_ptr._6_1_ = uVar2;
        __ref._M_ptr._0_6_ = in_stack_ffffffffffffff20;
        __ref._M_ptr._7_1_ = in_stack_ffffffffffffff27;
        std::auto_ptr<Clara::CommandLine<Catch::ConfigData>::Arg>::operator=
                  ((auto_ptr<Clara::CommandLine<Catch::ConfigData>::Arg> *)in_stack_ffffffffffffff18
                   ,__ref);
        std::auto_ptr<Clara::CommandLine<Catch::ConfigData>::Arg>::~auto_ptr
                  ((auto_ptr<Clara::CommandLine<Catch::ConfigData>::Arg> *)in_stack_ffffffffffffff10
                  );
      }
      else {
        std::
        vector<Clara::CommandLine<Catch::ConfigData>::Arg,_std::allocator<Clara::CommandLine<Catch::ConfigData>::Arg>_>
        ::push_back((vector<Clara::CommandLine<Catch::ConfigData>::Arg,_std::allocator<Clara::CommandLine<Catch::ConfigData>::Arg>_>
                     *)CONCAT17(in_stack_ffffffffffffff27,CONCAT16(uVar2,in_stack_ffffffffffffff20))
                    ,(value_type *)in_stack_ffffffffffffff18);
      }
    }
  }
  Arg::~Arg(in_stack_ffffffffffffff10);
  return;
}

Assistant:

~ArgBinder() {
                if( m_cl ) {
                    m_arg.validate();
                    if( m_arg.isFixedPositional() ) {
                        m_cl->m_positionalArgs.insert( std::make_pair( m_arg.position, m_arg ) );
                        if( m_arg.position > m_cl->m_highestSpecifiedArgPosition )
                            m_cl->m_highestSpecifiedArgPosition = m_arg.position;
                    }
                    else if( m_arg.isAnyPositional() ) {
                        if( m_cl->m_arg.get() )
                            throw std::logic_error( "Only one unpositional argument can be added" );
                        m_cl->m_arg = std::auto_ptr<Arg>( new Arg( m_arg ) );
                    }
                    else
                        m_cl->m_options.push_back( m_arg );
                }
            }